

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Am_Drop_Target_Do_Method *method)

{
  (*(method->from_wrapper->super_Am_Registered_Type)._vptr_Am_Registered_Type[2])
            (method->from_wrapper,os);
  return os;
}

Assistant:

Am_Define_Method(Am_Current_Location_Method, void, sel_move_inter_interim_do,
                 (Am_Object inter, Am_Object object_modified,
                  Am_Inter_Location data))
{
  Am_Object feedback;
  feedback = inter.Get(Am_FEEDBACK_OBJECT);
  // Test background to see if moving is allowed there
  Am_Object final_owner = Am_Find_Destination_Group(object_modified, inter);
  Am_Object prev_owner = inter.Get(Am_SAVED_OLD_OWNER);
  if (final_owner != prev_owner) {
    inter.Set(Am_SAVED_OLD_OWNER, final_owner, Am_OK_IF_NOT_THERE);
    if (final_owner.Valid()) {
      Am_Value value;
      value = final_owner.Peek(Am_DROP_TARGET);
      if (value.Valid()) {
        Am_Object target = value;
        value = target.Peek(Am_DROP_TARGET_TEST);
        if (value.Valid() &&
            Am_Drop_Target_Background_Interim_Do_Method::Test(value)) {
          Am_Drop_Target_Background_Interim_Do_Method interim(value);
          Am_Value selected = inter.Get_Owner().Get(Am_VALUE);
          Am_Background_Drop_Result result =
              interim.Call(target, data, selected);
          if (result == Am_DROP_NOT_ALLOWED) {
            if (feedback.Valid())
              feedback.Set(Am_VISIBLE, false);
            return;
          }
        }
      }
      if (feedback.Valid())
        feedback.Set(Am_VISIBLE, true);
    }
  }

  //if get here, then moved enough, so move the feedback
  if (!feedback.Valid())
    feedback = object_modified; //this shouldn't happen
  Am_Check_And_Fix_Feedback_Group(feedback, inter);
  Am_Modify_Object_Pos(feedback, data, false);

  Am_Value drop_test_value;
  drop_test_value = inter.Get_Owner().Get(Am_DROP_TARGET_TEST);
  if (!drop_test_value.Valid())
    return;

  Am_Object event_window = inter.Get(Am_WINDOW);
  int x = inter.Get(Am_INTERIM_X);
  int y = inter.Get(Am_INTERIM_Y);
  Am_Object leaf;
  if (Am_Where_Method::Test(drop_test_value)) {
    Am_Where_Method drop_test(drop_test_value);
    leaf = drop_test.Call(inter, event_window, event_window, x, y);
  }
  Am_Value target_value;
  Am_Object target, prev_target;
  while (leaf.Valid()) {
    target_value = leaf.Peek(Am_DROP_TARGET);
    if (target_value.Valid()) {
      if (target_value.type != Am_OBJECT)
        Am_ERROR("Discovered an object with a non-command"
                 " Am_DROP_TARGET_SLOT");
      Am_Object target(target_value);
      prev_target = inter.Get(Am_DROP_TARGET);
      if (target != prev_target) {
        bool valid = false;
        target_value = target.Peek(Am_DROP_TARGET_TEST);
        if (target_value.Valid()) {
          Am_Value selected = inter.Get_Owner().Get(Am_VALUE);
          if (Am_Drop_Target_Interim_Do_Method::Test(target_value)) {
            Am_Drop_Target_Interim_Do_Method interim_test(target_value);
            valid = interim_test.Call(target, selected);
          } else if (Am_Drop_Target_Background_Interim_Do_Method::Test(
                         target_value)) {
            Am_Drop_Target_Background_Interim_Do_Method interim_test(
                target_value);
            /* Am_Background_Drop_Result result = */
            interim_test.Call(target, data, selected);
            valid = false;
          }
        } else
          valid = true;
        if (valid) {
          inter.Set(Am_DROP_TARGET, target);
          target.Set(Am_INTERIM_SELECTED, true);
        } else
          inter.Set(Am_DROP_TARGET, Am_No_Object);
        if (prev_target.Valid())
          prev_target.Set(Am_INTERIM_SELECTED, false);
      }
      return;
    }
    leaf = leaf.Get_Owner();
  }
  prev_target = inter.Get(Am_DROP_TARGET);
  if (prev_target.Valid())
    prev_target.Set(Am_INTERIM_SELECTED, false);
  inter.Set(Am_DROP_TARGET, Am_No_Object);
}